

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O1

ErrorNumber checkDataSame(TA_Real *data,TA_Real *originalInput,uint nbElement)

{
  ErrorNumber EVar1;
  ulong uVar2;
  
  EVar1 = checkForNAN(data,nbElement);
  if (EVar1 == TA_TEST_PASS) {
    if (nbElement < 0x119) {
      if (nbElement != 0) {
        uVar2 = 0;
        do {
          if ((originalInput[uVar2] != data[uVar2]) ||
             (NAN(originalInput[uVar2]) || NAN(data[uVar2]))) {
            printf("Fail: Data was wrongly modified (%f,%f,%d)\n");
            return TA_TEST_TFRR_INPUT_HAS_BEEN_MODIFIED;
          }
          uVar2 = uVar2 + 1;
        } while (nbElement != uVar2);
      }
      EVar1 = TA_TEST_PASS;
    }
    else {
      printf("Fail: outNbElement is out of range 1 (%d)\n",(ulong)nbElement);
      EVar1 = TA_TEST_TFRR_NB_ELEMENT_OUT_OF_RANGE;
    }
  }
  return EVar1;
}

Assistant:

ErrorNumber checkDataSame( const TA_Real *data,
                           const TA_Real *originalInput,
                           unsigned int nbElement )
{
   unsigned int i;
   ErrorNumber errNb;

   errNb = checkForNAN( data, nbElement );

   if( errNb != TA_TEST_PASS )
       return errNb;

   if( nbElement > MAX_NB_TEST_ELEMENT )
   {
       printf( "Fail: outNbElement is out of range 1 (%d)\n", nbElement );
       return TA_TEST_TFRR_NB_ELEMENT_OUT_OF_RANGE;
   }

   for( i=0; i < nbElement; i++ )
   {
      if( originalInput[i] != data[i] )
      {
         printf( "Fail: Data was wrongly modified (%f,%f,%d)\n",
                 originalInput[i],
                 data[i], i );
         return TA_TEST_TFRR_INPUT_HAS_BEEN_MODIFIED;
      }
   }

   return TA_TEST_PASS;
}